

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

char * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getStringUnchecked(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
                  ValueLength *length)

{
  byte *pbVar1;
  ulong uVar2;
  long lVar3;
  
  pbVar1 = *(byte **)this;
  if ((byte)(*pbVar1 - 0x40) < 0x7f) {
    uVar2 = (ulong)(*pbVar1 - 0x40);
    lVar3 = 1;
  }
  else {
    uVar2 = *(ulong *)(pbVar1 + 1);
    lVar3 = 9;
  }
  *length = uVar2;
  return (char *)(pbVar1 + lVar3);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }